

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_case(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  ly_stmt lVar1;
  lysp_node *plVar2;
  LY_ERR LVar3;
  lysp_node *parent_00;
  char *pcVar4;
  ly_ctx *local_c8;
  ly_ctx *local_c0;
  ly_ctx *local_b0;
  ly_ctx *local_a8;
  LY_ERR ret___14;
  LY_ERR ret___13;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  long *plStack_58;
  LY_ERR ret___1;
  char **iter__;
  size_t offset__;
  char *p__;
  LY_ERR ret__;
  lysp_node_case *cas;
  lysp_node **siblings_local;
  lysp_node *parent_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    parent_00 = (lysp_node *)calloc(1,0x50);
    if (parent_00 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_a8 = (ly_ctx *)0x0;
      }
      else {
        local_a8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_a8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_case");
      ctx_local._4_4_ = LY_EMEM;
    }
    else {
      if (*siblings == (lysp_node *)0x0) {
        *siblings = parent_00;
      }
      else {
        plVar2 = *siblings;
        while (plStack_58 = (long *)((long)plVar2 + (long)*siblings + (0x10 - (long)*siblings)),
              *plStack_58 != 0) {
          plVar2 = (lysp_node *)*plStack_58;
        }
        *plStack_58 = (long)parent_00;
      }
      if (ctx == (lysp_ctx *)0x0) {
        local_b0 = (ly_ctx *)0x0;
      }
      else {
        local_b0 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ctx_local._4_4_ = lydict_insert(local_b0,stmt->arg,0,&parent_00->name);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        parent_00->nodetype = 0x80;
        parent_00->parent = parent;
        for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
          lVar1 = _ret___3->kw;
          if (lVar1 == LY_STMT_ANYDATA) {
            if (*(byte *)&(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1][2].schema
                < 2) {
              if (ctx == (lysp_ctx *)0x0) {
                local_c0 = (ly_ctx *)0x0;
              }
              else {
                local_c0 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              ly_vlog(local_c0,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ,"anydata","case");
              return LY_EVALID;
            }
LAB_001aca01:
            LVar3 = lysp_stmt_any(ctx,_ret___3,parent_00,&parent_00[1].parent);
          }
          else {
            if (lVar1 == LY_STMT_ANYXML) goto LAB_001aca01;
            if (lVar1 == LY_STMT_CHOICE) {
              LVar3 = lysp_stmt_choice(ctx,_ret___3,parent_00,&parent_00[1].parent);
            }
            else if (lVar1 == LY_STMT_CONTAINER) {
              LVar3 = lysp_stmt_container(ctx,_ret___3,parent_00,&parent_00[1].parent);
            }
            else if (lVar1 == LY_STMT_LEAF) {
              LVar3 = lysp_stmt_leaf(ctx,_ret___3,parent_00,&parent_00[1].parent);
            }
            else if (lVar1 == LY_STMT_LEAF_LIST) {
              LVar3 = lysp_stmt_leaflist(ctx,_ret___3,parent_00,&parent_00[1].parent);
            }
            else if (lVar1 == LY_STMT_LIST) {
              LVar3 = lysp_stmt_list(ctx,_ret___3,parent_00,&parent_00[1].parent);
            }
            else if (lVar1 == LY_STMT_USES) {
              LVar3 = lysp_stmt_uses(ctx,_ret___3,parent_00,&parent_00[1].parent);
            }
            else if (lVar1 == LY_STMT_DESCRIPTION) {
              LVar3 = lysp_stmt_text_field
                                (ctx,_ret___3,0,&parent_00->dsc,Y_STR_ARG,&parent_00->exts);
            }
            else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
              LVar3 = lysp_stmt_ext(ctx,_ret___3,LY_STMT_CASE,0,&parent_00->exts);
            }
            else if (lVar1 == LY_STMT_IF_FEATURE) {
              LVar3 = lysp_stmt_qnames(ctx,_ret___3,&parent_00->iffeatures,Y_STR_ARG,
                                       &parent_00->exts);
            }
            else if (lVar1 == LY_STMT_REFERENCE) {
              LVar3 = lysp_stmt_text_field
                                (ctx,_ret___3,0,&parent_00->ref,Y_STR_ARG,&parent_00->exts);
            }
            else if (lVar1 == LY_STMT_STATUS) {
              LVar3 = lysp_stmt_status(ctx,_ret___3,&parent_00->flags,&parent_00->exts);
            }
            else {
              if (lVar1 != LY_STMT_WHEN) {
                if (ctx == (lysp_ctx *)0x0) {
                  local_c8 = (ly_ctx *)0x0;
                }
                else {
                  local_c8 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar4 = lyplg_ext_stmt2str(_ret___3->kw);
                ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"case");
                return LY_EVALID;
              }
              LVar3 = lysp_stmt_when(ctx,_ret___3,(lysp_when **)&parent_00[1].nodetype);
            }
          }
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
        }
        ctx_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_case(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_case *cas;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new case structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, cas, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &cas->name));
    cas->nodetype = LYS_CASE;
    cas->parent = parent;

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &cas->dsc, Y_STR_ARG, &cas->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &cas->iffeatures, Y_STR_ARG, &cas->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &cas->ref, Y_STR_ARG, &cas->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &cas->flags, &cas->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &cas->when));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "case");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(lysp_stmt_choice(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(lysp_stmt_uses(ctx, child, &cas->node, &cas->child));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_CASE, 0, &cas->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "case");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}